

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O2

ConsumeResult * __thiscall
binlog::Session::reconsumeMetadata<TestStream>
          (ConsumeResult *__return_storage_ptr__,Session *this,TestStream *out)

{
  size_t sVar1;
  size_t in_RCX;
  pointer pcVar2;
  
  std::mutex::lock(&this->_mutex);
  __return_storage_ptr__->channelsPolled = 0;
  __return_storage_ptr__->channelsRemoved = 0;
  __return_storage_ptr__->bytesConsumed = 0;
  __return_storage_ptr__->totalBytesConsumed = 0;
  pcVar2 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  TestStream::write(out,(int)pcVar2 + 0x18,
                    (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_finish + (-0x18 - (long)pcVar2),in_RCX);
  pcVar2 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish +
           (-0x18 - (long)(this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  __return_storage_ptr__->bytesConsumed = (size_t)pcVar2;
  TestStream::write(out,(int)(this->_sources)._vector.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start + 0x18,
                    (void *)this->_sourcesConsumePos,in_RCX);
  pcVar2 = pcVar2 + this->_sourcesConsumePos;
  __return_storage_ptr__->bytesConsumed = (size_t)pcVar2;
  sVar1 = this->_totalConsumedBytes;
  this->_totalConsumedBytes = (size_t)(pcVar2 + sVar1);
  __return_storage_ptr__->totalBytesConsumed = (size_t)(pcVar2 + sVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

Session::ConsumeResult Session::reconsumeMetadata(OutputStream& out)
{
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add clock sync
  out.write(_clockSync.data(), _clockSync.ssize());
  result.bytesConsumed += std::size_t(_clockSync.ssize());

  // add consumed sources
  out.write(_sources.data(), _sourcesConsumePos);
  result.bytesConsumed += std::size_t(_sourcesConsumePos);

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;
  return result;
}